

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O0

int __thiscall
CsSignal::SignalBase::internal_cntConnections
          (SignalBase *this,SlotBase *receiver,BentoAbstract *signalMethod_Bento)

{
  undefined4 uVar1;
  bool bVar2;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *this_00;
  ConnectStruct *this_01;
  type this_02;
  ConnectStruct *item;
  const_iterator cStack_68;
  end_iterator __end1;
  const_iterator __begin1;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *__range1;
  read_handle senderListHandle;
  int retval;
  BentoAbstract *signalMethod_Bento_local;
  SlotBase *receiver_local;
  SignalBase *this_local;
  
  senderListHandle._28_4_ = 0;
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::lock_read((read_handle *)&__range1,&this->m_connectList);
  this_00 = libguarded::
            rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
            ::read_handle::operator*((read_handle *)&__range1);
  cStack_68 = libguarded::
              rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
              ::begin(this_00);
  libguarded::
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  ::end(this_00);
  while (bVar2 = libguarded::
                 rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
                 ::const_iterator::operator!=
                           (&stack0xffffffffffffff98,(end_iterator *)((long)&item + 7)),
        uVar1 = senderListHandle._28_4_, bVar2) {
    this_01 = libguarded::
              rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
              ::const_iterator::operator*(&stack0xffffffffffffff98);
    if ((receiver == (SlotBase *)0x0) || (this_01->receiver == receiver)) {
      this_02 = std::
                unique_ptr<const_CsSignal::Internal::BentoAbstract,_std::default_delete<const_CsSignal::Internal::BentoAbstract>_>
                ::operator*(&this_01->signalMethod);
      bVar2 = Internal::BentoAbstract::operator!=(this_02,signalMethod_Bento);
      if (!bVar2) {
        senderListHandle._28_4_ = senderListHandle._28_4_ + 1;
      }
    }
    libguarded::
    rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
    ::const_iterator::operator++(&stack0xffffffffffffff98);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle((read_handle *)&__range1);
  return uVar1;
}

Assistant:

int CsSignal::SignalBase::internal_cntConnections(const SlotBase *receiver,
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   int retval = 0;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (receiver && item.receiver != receiver) {
         continue;
      }

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval++;
   }

   return retval;
}